

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::addColorBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::TextureBuffer> *textureBufferIn)

{
  int *piVar1;
  runtime_error *this_00;
  shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer> textureBuffer;
  __shared_ptr<polyscope::render::TextureBuffer,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL_mock::GLTextureBuffer,polyscope::render::TextureBuffer>
            ((shared_ptr<polyscope::render::TextureBuffer> *)&textureBuffer);
  if (textureBuffer.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
    std::__shared_ptr<polyscope::render::TextureBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,void>
              (local_28,&textureBuffer.
                         super___shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
              );
    std::
    vector<std::shared_ptr<polyscope::render::TextureBuffer>,std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>>>
    ::emplace_back<std::shared_ptr<polyscope::render::TextureBuffer>>
              ((vector<std::shared_ptr<polyscope::render::TextureBuffer>,std::allocator<std::shared_ptr<polyscope::render::TextureBuffer>>>
                *)&(this->super_FrameBuffer).textureBuffersColor,
               (shared_ptr<polyscope::render::TextureBuffer> *)local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
    piVar1 = &(this->super_FrameBuffer).nColorBuffers;
    *piVar1 = *piVar1 + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&textureBuffer.
                super___shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"tried to bind to non-GL texture buffer");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLFrameBuffer::addColorBuffer(std::shared_ptr<TextureBuffer> textureBufferIn) {

  // it _better_ be a GL buffer
  std::shared_ptr<GLTextureBuffer> textureBuffer = std::dynamic_pointer_cast<GLTextureBuffer>(textureBufferIn);
  if (!textureBuffer) throw std::runtime_error("tried to bind to non-GL texture buffer");

  textureBuffer->bind();
  bind();
  checkGLError();

  // Sanity checks
  // if (colorRenderBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to render buffer");
  // if (colorTextureBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to texture buffer");

  checkGLError();
  textureBuffersColor.push_back(textureBuffer);
  nColorBuffers++;
}